

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGCompareElemDefLists
              (xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict *def1,
              xmlRelaxNGDefinePtr_conflict *def2)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict def2_00;
  xmlRelaxNGDefinePtr_conflict *ppxVar2;
  
  iVar1 = 1;
  if (((def1 != (xmlRelaxNGDefinePtr_conflict *)0x0 && ctxt != (xmlRelaxNGParserCtxtPtr)0x0) &&
      (ctxt->userData != (void *)0x0)) &&
     (def2_00 = *def1, def2_00 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
    ppxVar2 = def1 + 1;
    while( true ) {
      while (def2_00 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        if (ctxt->error == (xmlRelaxNGValidityErrorFunc)0x0) {
          return 1;
        }
        ctxt = (xmlRelaxNGParserCtxtPtr)&ctxt->error;
        ppxVar2 = def1 + 1;
        def2_00 = *def1;
      }
      iVar1 = xmlRelaxNGCompareNameClasses((xmlRelaxNGDefinePtr_conflict)ctxt->userData,def2_00);
      if (iVar1 == 0) break;
      def2_00 = *ppxVar2;
      ppxVar2 = ppxVar2 + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
xmlRelaxNGCompareElemDefLists(xmlRelaxNGParserCtxtPtr ctxt
                              ATTRIBUTE_UNUSED, xmlRelaxNGDefinePtr * def1,
                              xmlRelaxNGDefinePtr * def2)
{
    xmlRelaxNGDefinePtr *basedef2 = def2;

    if ((def1 == NULL) || (def2 == NULL))
        return (1);
    if ((*def1 == NULL) || (*def2 == NULL))
        return (1);
    while (*def1 != NULL) {
        while ((*def2) != NULL) {
            if (xmlRelaxNGCompareNameClasses(*def1, *def2) == 0)
                return (0);
            def2++;
        }
        def2 = basedef2;
        def1++;
    }
    return (1);
}